

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasExtensionsOrExtendableMessage(Descriptor *descriptor)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  Descriptor *descriptor_00;
  ulong uVar5;
  
  bVar3 = true;
  if ((*(int *)(descriptor + 0x78) < 1) && (*(int *)(descriptor + 0x7c) < 1)) {
    uVar5 = (ulong)*(int *)(descriptor + 0x70);
    bVar3 = 0 < (long)uVar5;
    if (0 < (long)uVar5) {
      descriptor_00 = *(Descriptor **)(descriptor + 0x38);
      bVar2 = HasExtensionsOrExtendableMessage(descriptor_00);
      if (!bVar2) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          descriptor_00 = descriptor_00 + 0x90;
          if (uVar5 == uVar4) break;
          bVar3 = HasExtensionsOrExtendableMessage(descriptor_00);
          uVar1 = uVar4 + 1;
        } while (!bVar3);
        bVar3 = uVar4 < uVar5;
      }
    }
  }
  return bVar3;
}

Assistant:

static bool HasExtensionsOrExtendableMessage(const Descriptor* descriptor) {
  if (descriptor->extension_range_count() > 0) return true;
  if (descriptor->extension_count() > 0) return true;
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasExtensionsOrExtendableMessage(descriptor->nested_type(i))) {
      return true;
    }
  }
  return false;
}